

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

upb_StringView upb_strtable_iter_key(upb_strtable_iter *i)

{
  byte bVar1;
  upb_strtable *puVar2;
  undefined4 *puVar3;
  char *mem;
  upb_StringView uVar4;
  
  puVar2 = i->t;
  if ((((puVar2 != (upb_strtable *)0x0) && (bVar1 = (puVar2->t).size_lg2, bVar1 != 0)) &&
      (i->index < (ulong)(long)(1 << (bVar1 & 0x1f)))) && ((puVar2->t).entries[i->index].key != 0))
  {
    puVar3 = (undefined4 *)(puVar2->t).entries[i->index].key;
    uVar4.data = puVar3 + 1;
    uVar4.size._0_4_ = *puVar3;
    uVar4.size._4_4_ = 0;
    return uVar4;
  }
  __assert_fail("!upb_strtable_done(i)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/hash/common.c"
                ,0x1f9,"upb_StringView upb_strtable_iter_key(const upb_strtable_iter *)");
}

Assistant:

upb_StringView upb_strtable_iter_key(const upb_strtable_iter* i) {
  upb_StringView key;
  uint32_t len;
  UPB_ASSERT(!upb_strtable_done(i));
  key.data = upb_tabstr(str_tabent(i)->key, &len);
  key.size = len;
  return key;
}